

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O0

void __thiscall google::protobuf::Type::SharedCtor(Type *this,Arena *arena)

{
  Arena *arena_local;
  Type *this_local;
  
  protobuf::MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x60),0,0xc);
  return;
}

Assistant:

inline void Type::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, source_context_),
           0,
           offsetof(Impl_, syntax_) -
               offsetof(Impl_, source_context_) +
               sizeof(Impl_::syntax_));
}